

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O2

void __thiscall CSEInit::CSEInit(CSEInit *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  byte bVar4;
  OpCode op;
  long lVar5;
  
  bVar4 = 1;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  lVar5 = 0;
  do {
    if (lVar5 == 0x4b3) {
      return;
    }
    op = (OpCode)lVar5;
    bVar2 = Js::OpCodeUtil::IsValidOpcode(op);
    if (bVar2) {
      bVar2 = OpCodeAttr::CanCSE(op);
      if (bVar2) {
        bVar2 = OpCodeAttr::ByteCodeOnly(op);
        if (!bVar2) {
          OpCodeToHash[lVar5] = bVar4;
          HashToOpCode[bVar4] = op;
          bVar4 = bVar4 + 1;
          if (bVar4 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                               ,0x1a,"(hash != 0)","Too many CSE\'able opcodes");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar3 = 0;
            bVar4 = 0;
          }
        }
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

CSEInit()
    {
        uint8 hash = 1;

        for (Js::OpCode opcode = (Js::OpCode)0; opcode < Js::OpCode::Count; opcode = (Js::OpCode)(opcode + 1))
        {
            if (Js::OpCodeUtil::IsValidOpcode(opcode) && OpCodeAttr::CanCSE(opcode) && !OpCodeAttr::ByteCodeOnly(opcode))
            {
                OpCodeToHash[(int)opcode] = hash;
                HashToOpCode[hash] = opcode;
                hash++;
                AssertMsg(hash != 0, "Too many CSE'able opcodes");
            }

        }
    }